

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[32],kj::CappedArray<char,17ul>,char_const(&)[4],unsigned_long&,kj::StringTree>
          (String *__return_storage_ptr__,kj *this,char (*params) [32],
          CappedArray<char,_17UL> *params_1,char (*params_2) [4],unsigned_long *params_3,
          StringTree *params_4)

{
  StringTree *in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  kj *local_68;
  size_t local_60;
  CappedArray<char,_26UL> local_58;
  
  local_60 = strlen((char *)this);
  local_78.size_ = *(size_t *)*params;
  local_78.ptr = *params + 8;
  local_68 = this;
  local_88.size_ = strlen((char *)params_1);
  local_88.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(unsigned_long *)params_2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::StringTree>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_26UL> *)params_3,
             in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}